

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O0

void ComplexMask_SSE2(__m128i *p1,__m128i *p0,__m128i *q0,__m128i *q1,int thresh,int ithresh,
                     __m128i *mask)

{
  __m128i *p1_00;
  undefined1 in_R9B;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  undefined1 auVar1 [16];
  char cVar13;
  __m128i filter_mask;
  __m128i thresh_mask;
  __m128i diff;
  __m128i it;
  undefined8 local_118;
  __m128i *in_stack_fffffffffffffef0;
  undefined1 local_58;
  undefined1 uStack_57;
  undefined1 uStack_56;
  undefined1 uStack_55;
  undefined1 uStack_54;
  undefined1 uStack_53;
  undefined1 uStack_52;
  undefined1 uStack_51;
  undefined1 uStack_50;
  undefined1 uStack_4f;
  undefined1 uStack_4e;
  undefined1 uStack_4d;
  undefined1 uStack_4c;
  undefined1 uStack_4b;
  undefined1 uStack_4a;
  undefined1 uStack_49;
  
  p1_00 = (__m128i *)
          CONCAT17(in_R9B,CONCAT16(in_R9B,CONCAT15(in_R9B,CONCAT14(in_R9B,CONCAT13(in_R9B,CONCAT12(
                                                  in_R9B,CONCAT11(in_R9B,in_R9B)))))));
  auVar1[9] = in_R9B;
  auVar1[8] = in_R9B;
  auVar1[10] = in_R9B;
  auVar1[0xb] = in_R9B;
  auVar1[0xc] = in_R9B;
  auVar1[0xd] = in_R9B;
  auVar1[0xe] = in_R9B;
  auVar1[0xf] = in_R9B;
  auVar1._0_8_ = p1_00;
  auVar1 = psubusb(*(undefined1 (*) [16])filter_mask[1],auVar1);
  local_58 = auVar1[0];
  uStack_57 = auVar1[1];
  uStack_56 = auVar1[2];
  uStack_55 = auVar1[3];
  uStack_54 = auVar1[4];
  uStack_53 = auVar1[5];
  uStack_52 = auVar1[6];
  uStack_51 = auVar1[7];
  uStack_50 = auVar1[8];
  uStack_4f = auVar1[9];
  uStack_4e = auVar1[10];
  uStack_4d = auVar1[0xb];
  uStack_4c = auVar1[0xc];
  uStack_4b = auVar1[0xd];
  uStack_4a = auVar1[0xe];
  uStack_49 = auVar1[0xf];
  cVar2 = -(uStack_54 == '\0');
  cVar3 = -(uStack_53 == '\0');
  cVar4 = -(uStack_52 == '\0');
  cVar5 = -(uStack_51 == '\0');
  cVar6 = -(uStack_50 == '\0');
  cVar7 = -(uStack_4f == '\0');
  cVar8 = -(uStack_4e == '\0');
  cVar9 = -(uStack_4d == '\0');
  cVar10 = -(uStack_4c == '\0');
  cVar11 = -(uStack_4b == '\0');
  cVar12 = -(uStack_4a == '\0');
  cVar13 = -(uStack_49 == '\0');
  NeedsFilter_SSE2(p1_00,auVar1._8_8_,auVar1._0_8_,
                   (__m128i *)
                   CONCAT17(cVar13,CONCAT16(cVar12,CONCAT15(cVar11,CONCAT14(cVar10,CONCAT13(cVar9,
                                                  CONCAT12(cVar8,CONCAT11(cVar7,cVar6))))))),
                   CONCAT13(cVar5,CONCAT12(cVar4,CONCAT11(cVar3,cVar2))),in_stack_fffffffffffffef0);
  *(ulong *)filter_mask[1] =
       CONCAT17(cVar5,CONCAT16(cVar4,CONCAT15(cVar3,CONCAT14(cVar2,CONCAT13(-(uStack_55 == '\0'),
                                                                            CONCAT12(-(uStack_56 ==
                                                                                      '\0'),CONCAT11
                                                  (-(uStack_57 == '\0'),-(local_58 == '\0')))))))) &
       local_118;
  *(ulong *)(filter_mask[1] + 8) =
       CONCAT17(cVar13,CONCAT16(cVar12,CONCAT15(cVar11,CONCAT14(cVar10,CONCAT13(cVar9,CONCAT12(cVar8
                                                  ,CONCAT11(cVar7,cVar6))))))) &
       (ulong)in_stack_fffffffffffffef0;
  return;
}

Assistant:

static WEBP_INLINE void ComplexMask_SSE2(const __m128i* const p1,
                                         const __m128i* const p0,
                                         const __m128i* const q0,
                                         const __m128i* const q1,
                                         int thresh, int ithresh,
                                         __m128i* const mask) {
  const __m128i it = _mm_set1_epi8(ithresh);
  const __m128i diff = _mm_subs_epu8(*mask, it);
  const __m128i thresh_mask = _mm_cmpeq_epi8(diff, _mm_setzero_si128());
  __m128i filter_mask;
  NeedsFilter_SSE2(p1, p0, q0, q1, thresh, &filter_mask);
  *mask = _mm_and_si128(thresh_mask, filter_mask);
}